

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
::val(value_type *__return_storage_ptr__,
     FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
     *this)

{
  value_type vStack_48;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_28;
  
  FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>
  ::val(&vStack_48,&this->left_->fadexpr_);
  local_28.fadexpr_.right_ = &this->right_->val_;
  local_28.fadexpr_.left_ = &vStack_48;
  Fad<double>::Fad<FadBinaryMul<Fad<double>,Fad<double>>>(__return_storage_ptr__,&local_28);
  Fad<double>::~Fad(&vStack_48);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}